

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall ON_ClassArray<ON_Layer>::Empty(ON_ClassArray<ON_Layer> *this)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)*(int *)(this + 0x10);
  if (0 < lVar1) {
    lVar2 = lVar1 * 0xe8;
    lVar1 = lVar1 + 1;
    do {
      lVar2 = lVar2 + -0xe8;
      (**(code **)(*(long *)(*(long *)(this + 8) + lVar2) + 0x18))(*(long *)(this + 8) + lVar2);
      memset((void *)(*(long *)(this + 8) + lVar2),0,0xe8);
      ON_Layer::ON_Layer((ON_Layer *)(*(long *)(this + 8) + lVar2));
      lVar1 = lVar1 + -1;
    } while (1 < lVar1);
  }
  *(undefined4 *)(this + 0x10) = 0;
  return;
}

Assistant:

void ON_ClassArray<T>::Empty()
{
  int i;
  for ( i = m_count-1; i >= 0; i-- ) {
    DestroyElement( m_a[i] );
    // This call to memset is ok even when T has a vtable
    // because in-place construction is used later.
    memset( (void*)(&m_a[i]), 0, sizeof(T) );
    ConstructDefaultElement( &m_a[i] );
  }
  m_count = 0;
}